

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

debugger_type * __thiscall
type_safe::basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_>::value
          (basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_> *this)

{
  basic_optional<type_safe::reference_optional_storage<debugger_type,_true>_> *local_20;
  char *local_18;
  undefined4 local_10;
  
  local_18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/optional.hpp"
  ;
  local_10 = 0x1b0;
  local_20 = this;
  debug_assert::detail::
  do_assert<type_safe::basic_optional<type_safe::reference_optional_storage<debugger_type,true>>::value()const&::_lambda()_1_,type_safe::detail::precondition_error_handler>
            (&local_20,&local_18,"has_value()");
  return (this->super_optional_storage<type_safe::reference_optional_storage<debugger_type,_true>_>)
         .storage.pointer_;
}

Assistant:

auto value() const TYPE_SAFE_LVALUE_REF noexcept
        -> decltype(std::declval<const storage&>().get_value())
    {
        DEBUG_ASSERT(has_value(), detail::precondition_error_handler{});
        return get_storage().get_value();
    }